

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  int iVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  iVar1 = cinfo->max_v_samp_factor;
  if (0 < (long)iVar1) {
    uVar5 = cinfo->image_width;
    if (0 < (int)(iVar6 * 2 - uVar5)) {
      lVar7 = 0;
      do {
        memset(input_data[lVar7] + uVar5,(uint)input_data[lVar7][(ulong)uVar5 - 1],
               (ulong)(iVar6 * 2 + ~uVar5) + 1);
        lVar7 = lVar7 + 1;
      } while (iVar1 != lVar7);
    }
  }
  if (0 < cinfo->max_v_samp_factor) {
    lVar7 = 0;
    do {
      if (iVar6 != 0) {
        pJVar2 = input_data[lVar7];
        pJVar3 = output_data[lVar7];
        lVar4 = 0;
        uVar5 = 0;
        do {
          pJVar3[lVar4] = (JSAMPLE)(pJVar2[lVar4 * 2] + uVar5 + (uint)pJVar2[lVar4 * 2 + 1] >> 1);
          uVar5 = uVar5 ^ 1;
          lVar4 = lVar4 + 1;
        } while (iVar6 != (int)lVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    bias = 0;			/* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr) + GETJSAMPLE(inptr[1])
			      + bias) >> 1);
      bias ^= 1;		/* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}